

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QRect __thiscall QToolBarAreaLayout::fitLayout(QToolBarAreaLayout *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Representation RVar4;
  QSize QVar5;
  QSize QVar6;
  QSize QVar7;
  QSize QVar8;
  ulong uVar9;
  QRect QVar10;
  QRect QVar11;
  
  if (this->visible == false) {
    uVar9._0_4_ = (this->rect).x1;
    uVar9._4_4_ = (this->rect).y1;
    QVar10 = this->rect;
  }
  else {
    QVar5 = QToolBarAreaLayoutInfo::sizeHint(this->docks);
    QVar6 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 1);
    QVar7 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 2);
    QVar8 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 3);
    QVar10 = QRect::adjusted(&this->rect,QVar5.wd.m_i.m_i,QVar7.ht.m_i.m_i,-QVar6.wd.m_i.m_i,
                             -QVar8.ht.m_i.m_i);
    uVar9 = QVar10._0_8_;
    iVar1 = (this->rect).x1.m_i;
    iVar2 = (this->rect).y1.m_i;
    iVar3 = (this->rect).x2.m_i;
    this->docks[2].rect.x1.m_i = iVar1;
    this->docks[2].rect.y1.m_i = iVar2;
    this->docks[2].rect.x2.m_i = iVar3;
    this->docks[2].rect.y2.m_i = QVar7.ht.m_i.m_i + iVar2 + -1;
    RVar4 = QVar10.y2.m_i;
    this->docks[0].rect.x1.m_i = iVar1;
    this->docks[0].rect.y1.m_i = QVar10.y1.m_i.m_i;
    this->docks[0].rect.x2.m_i = QVar5.wd.m_i.m_i + iVar1 + -1;
    this->docks[0].rect.y2.m_i = RVar4.m_i;
    this->docks[1].rect.x1.m_i = QVar10.x2.m_i.m_i + 1;
    this->docks[1].rect.y1.m_i = QVar10.y1.m_i.m_i;
    this->docks[1].rect.x2.m_i = QVar10.x2.m_i.m_i + QVar6.wd.m_i.m_i;
    this->docks[1].rect.y2.m_i = RVar4.m_i;
    this->docks[3].rect.x1.m_i = iVar1;
    this->docks[3].rect.y1.m_i = RVar4.m_i + 1;
    this->docks[3].rect.x2.m_i = iVar3;
    this->docks[3].rect.y2.m_i = RVar4.m_i + QVar8.ht.m_i.m_i;
    QToolBarAreaLayoutInfo::fitLayout(this->docks + 2);
    QToolBarAreaLayoutInfo::fitLayout(this->docks);
    QToolBarAreaLayoutInfo::fitLayout(this->docks + 1);
    QToolBarAreaLayoutInfo::fitLayout(this->docks + 3);
  }
  QVar11._0_8_ = QVar10._0_8_ & 0xffffffff | uVar9 & 0xffffffff00000000;
  QVar11.x2.m_i = (int)QVar10._8_8_;
  QVar11.y2.m_i = (int)((ulong)QVar10._8_8_ >> 0x20);
  return QVar11;
}

Assistant:

QRect QToolBarAreaLayout::fitLayout()
{
    if (!visible)
        return rect;

    QSize left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize right_hint = docks[QInternal::RightDock].sizeHint();
    QSize top_hint = docks[QInternal::TopDock].sizeHint();
    QSize bottom_hint = docks[QInternal::BottomDock].sizeHint();

    QRect center = rect.adjusted(left_hint.width(), top_hint.height(),
                                    -right_hint.width(), -bottom_hint.height());

    docks[QInternal::TopDock].rect = QRect(rect.left(), rect.top(),
                                rect.width(), top_hint.height());
    docks[QInternal::LeftDock].rect = QRect(rect.left(), center.top(),
                                left_hint.width(), center.height());
    docks[QInternal::RightDock].rect = QRect(center.right() + 1, center.top(),
                                    right_hint.width(), center.height());
    docks[QInternal::BottomDock].rect = QRect(rect.left(), center.bottom() + 1,
                                    rect.width(), bottom_hint.height());

    docks[QInternal::TopDock].fitLayout();
    docks[QInternal::LeftDock].fitLayout();
    docks[QInternal::RightDock].fitLayout();
    docks[QInternal::BottomDock].fitLayout();

    return center;
}